

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMiterForCofactors(Abc_Ntk_t *pNtk,int Out,int In1,int In2)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pOutput2;
  Abc_Obj_t *pOutput1;
  Abc_Obj_t *pRoot;
  Abc_Ntk_t *pNtkMiter;
  char Buffer [1000];
  int In2_local;
  int In1_local;
  int Out_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x208,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  if (iVar1 <= Out) {
    __assert_fail("Out < Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x209,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  if (iVar1 <= In1) {
    __assert_fail("In1 < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x20a,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  if (iVar1 <= In2) {
    __assert_fail("In2 < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x20b,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x20c,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pAVar2 = Abc_NtkCo(pNtk,Out);
  pcVar3 = Abc_ObjName(pAVar2);
  sprintf((char *)&pNtkMiter,"%s_miter",pcVar3);
  pcVar3 = Extra_UtilStrsav((char *)&pNtkMiter);
  pNtk_local->pName = pcVar3;
  pAVar2 = Abc_NtkCo(pNtk,Out);
  Abc_NtkMiterPrepare(pNtk,pNtk,pNtk_local,1,-1,0);
  pAVar4 = Abc_AigConst1(pNtk_local);
  pAVar4 = Abc_ObjNot(pAVar4);
  pAVar5 = Abc_NtkCi(pNtk,In1);
  (pAVar5->field_6).pCopy = pAVar4;
  if (-1 < In2) {
    pAVar4 = Abc_AigConst1(pNtk_local);
    pAVar5 = Abc_NtkCi(pNtk,In2);
    (pAVar5->field_6).pCopy = pAVar4;
  }
  Abc_NtkMiterAddCone(pNtk,pNtk_local,pAVar2);
  pAVar4 = Abc_ObjFanin0(pAVar2);
  pAVar4 = (pAVar4->field_6).pCopy;
  pAVar5 = Abc_AigConst1(pNtk_local);
  pAVar6 = Abc_NtkCi(pNtk,In1);
  (pAVar6->field_6).pCopy = pAVar5;
  if (-1 < In2) {
    pAVar5 = Abc_AigConst1(pNtk_local);
    pAVar5 = Abc_ObjNot(pAVar5);
    pAVar6 = Abc_NtkCi(pNtk,In2);
    (pAVar6->field_6).pCopy = pAVar5;
  }
  Abc_NtkMiterAddCone(pNtk,pNtk_local,pAVar2);
  pAVar2 = Abc_ObjFanin0(pAVar2);
  pAVar2 = Abc_AigXor((Abc_Aig_t *)pNtk_local->pManFunc,pAVar4,(pAVar2->field_6).pCopy);
  pAVar4 = Abc_NtkPo(pNtk_local,0);
  Abc_ObjAddFanin(pAVar4,pAVar2);
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkMiter: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterForCofactors( Abc_Ntk_t * pNtk, int Out, int In1, int In2 )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1, * pOutput2, * pMiter;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Out < Abc_NtkCoNum(pNtk) );
    assert( In1 < Abc_NtkCiNum(pNtk) );
    assert( In2 < Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_miter", Abc_ObjName(Abc_NtkCo(pNtk, Out)) );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // get the root output
    pRoot = Abc_NtkCo( pNtk, Out );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Abc_NtkCi(pNtk, In1)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
    if ( In2 >= 0 )
    Abc_NtkCi(pNtk, In2)->pCopy = Abc_AigConst1(pNtkMiter);
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput1 = Abc_ObjFanin0(pRoot)->pCopy;

    // set the second cofactor
    Abc_NtkCi(pNtk, In1)->pCopy = Abc_AigConst1(pNtkMiter);
    if ( In2 >= 0 )
    Abc_NtkCi(pNtk, In2)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
    // add the second cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput2 = Abc_ObjFanin0(pRoot)->pCopy;

    // create the miter of the two outputs
    pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiter: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}